

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double brcomp(double *a,double *b,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *y_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  brcomp::brcomp = 0.0;
  if (((*x == 0.0) && (!NAN(*x))) || ((*y == 0.0 && (!NAN(*y))))) {
    a_local = (double *)0x0;
  }
  else {
    brcomp::a0 = fifdmin1(*a,*b);
    if (brcomp::a0 < 8.0) {
      if (*x <= 0.375) {
        brcomp::lnx = log(*x);
        brcomp::T1 = -*x;
        brcomp::lny = alnrel(&brcomp::T1);
      }
      else if (*y <= 0.375) {
        brcomp::T2 = -*y;
        brcomp::lnx = alnrel(&brcomp::T2);
        brcomp::lny = log(*y);
      }
      else {
        brcomp::lnx = log(*x);
        brcomp::lny = log(*y);
      }
      brcomp::z = *a * brcomp::lnx + *b * brcomp::lny;
      if (1.0 <= brcomp::a0) {
        dVar1 = betaln(a,b);
        brcomp::z = brcomp::z - dVar1;
        a_local = (double *)exp(brcomp::z);
      }
      else {
        brcomp::b0 = fifdmax1(*a,*b);
        if (brcomp::b0 < 8.0) {
          if (brcomp::b0 <= 1.0) {
            brcomp::brcomp = exp(brcomp::z);
            if ((brcomp::brcomp != 0.0) || (a_local = (double *)brcomp::brcomp, NAN(brcomp::brcomp))
               ) {
              brcomp::apb = *a + *b;
              if (brcomp::apb <= 1.0) {
                dVar1 = gam1(&brcomp::apb);
                brcomp::z = dVar1 + 1.0;
              }
              else {
                brcomp::u = (*a + *b) - 1.0;
                dVar1 = gam1(&brcomp::u);
                brcomp::z = (dVar1 + 1.0) / brcomp::apb;
              }
              dVar1 = gam1(a);
              dVar3 = gam1(b);
              brcomp::c = ((dVar1 + 1.0) * (dVar3 + 1.0)) / brcomp::z;
              a_local = (double *)
                        ((brcomp::brcomp * brcomp::a0 * brcomp::c) / (brcomp::a0 / brcomp::b0 + 1.0)
                        );
            }
          }
          else {
            brcomp::u = gamln1(&brcomp::a0);
            brcomp::n = (int)(brcomp::b0 - 1.0);
            if (0 < brcomp::n) {
              brcomp::c = 1.0;
              for (brcomp::i = 1; brcomp::i <= brcomp::n; brcomp::i = brcomp::i + 1) {
                brcomp::b0 = brcomp::b0 - 1.0;
                brcomp::c = (brcomp::b0 / (brcomp::a0 + brcomp::b0)) * brcomp::c;
              }
              dVar1 = log(brcomp::c);
              brcomp::u = dVar1 + brcomp::u;
            }
            brcomp::z = brcomp::z - brcomp::u;
            brcomp::b0 = brcomp::b0 - 1.0;
            brcomp::apb = brcomp::a0 + brcomp::b0;
            if (brcomp::apb <= 1.0) {
              dVar1 = gam1(&brcomp::apb);
              brcomp::t = dVar1 + 1.0;
            }
            else {
              brcomp::u = (brcomp::a0 + brcomp::b0) - 1.0;
              dVar1 = gam1(&brcomp::u);
              brcomp::t = (dVar1 + 1.0) / brcomp::apb;
            }
            dVar1 = brcomp::a0;
            dVar3 = exp(brcomp::z);
            dVar2 = gam1(&brcomp::b0);
            a_local = (double *)((dVar1 * dVar3 * (dVar2 + 1.0)) / brcomp::t);
          }
        }
        else {
          dVar3 = gamln1(&brcomp::a0);
          dVar2 = algdiv(&brcomp::a0,&brcomp::b0);
          dVar1 = brcomp::a0;
          brcomp::u = dVar3 + dVar2;
          dVar3 = exp(brcomp::z - brcomp::u);
          a_local = (double *)(dVar1 * dVar3);
        }
      }
    }
    else {
      if (*a < *b || *a == *b) {
        brcomp::h = *a / *b;
        brcomp::x0 = brcomp::h / (brcomp::h + 1.0);
        brcomp::y0 = 1.0 / (brcomp::h + 1.0);
        brcomp::lambda = -(*a + *b) * *x + *a;
      }
      else {
        brcomp::h = *b / *a;
        brcomp::x0 = 1.0 / (brcomp::h + 1.0);
        brcomp::y0 = brcomp::h / (brcomp::h + 1.0);
        brcomp::lambda = (*a + *b) * *y + -*b;
      }
      dVar1 = -(brcomp::lambda / *a);
      brcomp::e = dVar1;
      if (ABS(dVar1) <= 0.6) {
        brcomp::u = rlog1(&brcomp::e);
      }
      else {
        dVar3 = log(*x / brcomp::x0);
        brcomp::u = dVar1 - dVar3;
      }
      dVar1 = brcomp::lambda / *b;
      brcomp::e = dVar1;
      if (ABS(dVar1) <= 0.6) {
        brcomp::v = rlog1(&brcomp::e);
      }
      else {
        dVar3 = log(*y / brcomp::y0);
        brcomp::v = dVar1 - dVar3;
      }
      brcomp::z = exp(-(*a * brcomp::u + *b * brcomp::v));
      dVar1 = brcomp::Const;
      dVar3 = sqrt(*b * brcomp::x0);
      dVar1 = dVar1 * dVar3 * brcomp::z;
      dVar3 = bcorr(a,b);
      dVar3 = exp(-dVar3);
      a_local = (double *)(dVar1 * dVar3);
    }
  }
  brcomp::brcomp = (double)a_local;
  return (double)a_local;
}

Assistant:

double brcomp(double *a,double *b,double *x,double *y)
/*
-----------------------------------------------------------------------
               EVALUATION OF X**A*Y**B/BETA(A,B)
-----------------------------------------------------------------------
*/
{
static double Const = .398942280401433e0;
static double brcomp,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
static int i,n;
/*
-----------------
     CONST = 1/SQRT(2*PI)
-----------------
*/
static double T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    brcomp = 0.0e0;
    if(*x == 0.0e0 || *y == 0.0e0) return brcomp;
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= betaln(a,b);
    brcomp = exp(z);
    return brcomp;
S40:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .LT. 1 OR B .LT. 1
-----------------------------------------------------------------------
*/
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
/*
                   ALGORITHM FOR B0 .LE. 1
*/
    brcomp = exp(z);
    if(brcomp == 0.0e0) return brcomp;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcomp = brcomp*(a0*c)/(1.0e0+a0/b0);
    return brcomp;
S70:
/*
                ALGORITHM FOR 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    n = b0-1.0e0;
    if(n < 1) goto S90;
    c = 1.0e0;
    for(i=1; i<=n; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcomp = a0*exp(z)*(1.0e0+gam1(&b0))/t;
    return brcomp;
S120:
/*
                   ALGORITHM FOR B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    brcomp = a0*exp(z-u);
    return brcomp;
S130:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .GE. 8 AND B .GE. 8
-----------------------------------------------------------------------
*/
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    z = exp(-(*a*u+*b*v));
    brcomp = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcomp;
}